

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QWidgetList * QWidgetPrivate::takeFromFocusChain(QWidget *from,QWidget *to,FocusDirection direction)

{
  initializer_list<QWidget_*> args;
  bool bVar1;
  QDebug *pQVar2;
  QWidget **ppQVar3;
  QWidgetPrivate *pQVar4;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *last;
  QWidget *first;
  QWidgetList path;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffeb8;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffec0;
  QWidget *this;
  QList<QWidget_*> *in_stack_fffffffffffffec8;
  QWidget *file;
  QMessageLogger *in_stack_fffffffffffffed0;
  QWidget *this_00;
  QDebug *in_stack_fffffffffffffed8;
  QWidget *debug;
  FocusDirection direction_00;
  QWidgetPrivate *pQVar5;
  QWidget *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff08;
  QWidget *t;
  QWidget *in_stack_ffffffffffffff38;
  QDebug *in_stack_ffffffffffffff40;
  QDebug local_a8;
  QDebug local_a0;
  undefined1 local_94 [32];
  QFlagsStorage<QWidgetPrivate::FocusChainRemovalRule> in_stack_ffffffffffffff8c;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QWidget *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = in_RDI;
  focusPath(in_stack_fffffffffffffef8,(QWidget *)in_RDI,(FocusDirection)((ulong)in_RDI >> 0x20));
  bVar1 = QList<QWidget_*>::isEmpty((QList<QWidget_*> *)0x373dc1);
  if (bVar1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    lcWidgetFocus();
    anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_20);
      if (!bVar1) break;
      anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x373e20);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
                 (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(char *)in_stack_fffffffffffffeb8,
                 (char *)0x373e39);
      QMessageLogger::debug();
      pQVar2 = QDebug::operator<<(in_stack_fffffffffffffed8,in_stack_ffffffffffffff08);
      QDebug::QDebug(&local_68,pQVar2);
      ::operator<<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      pQVar2 = QDebug::operator<<(in_stack_fffffffffffffed8,in_stack_ffffffffffffff08);
      QDebug::QDebug(&local_58,pQVar2);
      ::operator<<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      QDebug::~QDebug(&local_50);
      QDebug::~QDebug(&local_58);
      QDebug::~QDebug(&local_60);
      QDebug::~QDebug(&local_68);
      QDebug::~QDebug(&local_70);
      local_18 = (undefined1 *)((ulong)local_18 & 0xffffffffffffff00);
    }
    memset(in_RDI,0,0x18);
    QList<QWidget_*>::QList((QList<QWidget_*> *)0x373f33);
  }
  else {
    ppQVar3 = QList<QWidget_*>::constFirst((QList<QWidget_*> *)in_stack_fffffffffffffec0);
    debug = *ppQVar3;
    ppQVar3 = QList<QWidget_*>::constLast((QList<QWidget_*> *)in_stack_fffffffffffffeb8);
    this_00 = *ppQVar3;
    if (debug == this_00) {
      pQVar4 = QWidget::d_func((QWidget *)0x373f84);
      direction_00 = (FocusDirection)((ulong)pQVar4 >> 0x20);
      memset(local_94,0,4);
      QFlags<QWidgetPrivate::FocusChainRemovalRule>::QFlags
                ((QFlags<QWidgetPrivate::FocusChainRemovalRule> *)0x373faa);
      removeFromFocusChain(in_RDI,(FocusChainRemovalRules)in_stack_ffffffffffffff8c.i,direction_00);
      args._M_len = (size_type)in_stack_fffffffffffffed8;
      args._M_array = (iterator)in_stack_fffffffffffffed0;
      local_10 = debug;
      QList<QWidget_*>::QList(in_stack_fffffffffffffec8,args);
    }
    else {
      pQVar4 = QWidget::d_func((QWidget *)0x37400e);
      this = pQVar4->focus_next;
      QWidget::d_func((QWidget *)0x374024);
      pQVar4 = QWidget::d_func((QWidget *)0x374030);
      pQVar4->focus_next = this;
      pQVar4 = QWidget::d_func((QWidget *)0x374046);
      file = pQVar4->focus_prev;
      QWidget::d_func((QWidget *)0x37405c);
      pQVar4 = QWidget::d_func((QWidget *)0x374068);
      pQVar4->focus_prev = file;
      t = this_00;
      pQVar4 = QWidget::d_func((QWidget *)0x374088);
      pQVar4->focus_prev = this_00;
      pQVar4 = QWidget::d_func((QWidget *)0x3740a8);
      pQVar4->focus_next = debug;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      lcWidgetFocus();
      anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)this,in_stack_fffffffffffffeb8);
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_30);
        if (!bVar1) break;
        anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x37410a);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)this_00,(char *)file,(int)((ulong)this >> 0x20),
                   (char *)in_stack_fffffffffffffeb8,(char *)0x374123);
        QMessageLogger::debug();
        ::operator<<((QDebug *)debug,(QList<QWidget_*> *)this_00);
        QDebug::operator<<((QDebug *)debug,(char *)t);
        QDebug::~QDebug(&local_a0);
        QDebug::~QDebug(&local_a8);
        local_28 = (undefined1 *)((ulong)local_28 & 0xffffffffffffff00);
      }
      QList<QWidget_*>::QList
                ((QList<QWidget_*> *)this,(QList<QWidget_*> *)in_stack_fffffffffffffeb8);
    }
  }
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x3741b7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QWidgetList *)pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetList QWidgetPrivate::takeFromFocusChain(QWidget *from,
                                               QWidget *to,
                                               FocusDirection direction)
{
    // Check if there is a path from->to in direction
    const QWidgetList path = focusPath(from, to , direction);
    if (path.isEmpty()) {
        qCDebug(lcWidgetFocus) << "No-op removal. Focus chain from" << from << "doesn't lead to " << to;
        return QWidgetList();
    }

    QWidget *first = path.constFirst();
    QWidget *last = path.constLast();
    if (first == last) {
        first->d_func()->removeFromFocusChain();
        return QWidgetList({first});
    }

    FOCUS_NEXT(FOCUS_PREV(first)) = FOCUS_NEXT(last);
    FOCUS_PREV(FOCUS_NEXT(last)) = FOCUS_PREV(first);
    FOCUS_PREV(first) = last;
    FOCUS_NEXT(last) = first;
    qCDebug(lcWidgetFocus) << path << "removed from focus chain";
    return path;
}